

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O2

void __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~buffer_queue(buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  long lVar3;
  
  std::mutex::lock(&this->b_mutex);
  pbVar1 = this->b_array;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar2 = *(long *)((long)&pbVar1[-1].field_2 + 8);
    if (lVar2 != 0) {
      lVar3 = lVar2 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&pbVar1[-1]._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__((void *)((long)&pbVar1[-1].field_2 + 8),lVar2 << 5 | 8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::condition_variable::~condition_variable(&this->b_cond);
  return;
}

Assistant:

~buffer_queue()
    {
        lock_guard<mutex> lck (b_mutex);
        if (b_array != NULL)
            delete [] b_array;
    }